

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O1

void anon_unknown.dwarf_5c0ec::Gc::expect_call
               (test_watch_thread *gc,string *path,process_identifier pid)

{
  int iVar1;
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *pTVar2;
  ActionInterface<int_(std::initializer_list<const_char_*>)> *impl;
  TypedExpectation<void_(const_int_&)> *pTVar3;
  undefined4 in_register_00000014;
  StringLike<std::__cxx11::basic_string<char>_> *str;
  void **in_R8;
  Expectation exp;
  Expectation local_158;
  int *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  Expectation local_110;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  _Any_data local_d8;
  code *local_c8;
  MatcherBase<std::initializer_list<const_char_*>_> local_b8;
  undefined1 local_a0 [8];
  size_type local_98;
  ElementsAreMatcher<std::tuple<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>_>
  local_90;
  MockSpec<int_(std::initializer_list<const_char_*>)> local_38;
  
  local_98 = (anonymous_namespace)::Gc::vacuum_exe_abi_cxx11_;
  testing::StrEq<char_const*>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138,(testing *)&local_98,
             (StringLike<const_char_*> *)CONCAT44(in_register_00000014,pid));
  testing::StrEq<std::__cxx11::string>(&local_100,(testing *)path,str);
  local_a0 = (undefined1  [8])0x0;
  testing::
  ElementsAre<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,decltype(nullptr)>
            (&local_90,(testing *)local_138,&local_100,
             (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0,in_R8);
  testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
            ((Matcher<std::initializer_list<const_char_*>_> *)&local_b8,
             (ElementsAreMatcher *)&local_90);
  test_watch_thread::gmock_spawn
            (&local_38,gc,(Matcher<std::initializer_list<const_char_*>_> *)&local_b8);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
           InternalExpectedAt(&local_38,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                              ,0x7b,"gc",
                              "spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr))"
                             );
  local_148 = (int *)operator_new(4);
  *local_148 = pid;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_140,local_148);
  impl = (ActionInterface<int_(std::initializer_list<const_char_*>)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00198750;
  iVar1 = *local_148;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(std::initializer_list<const_char_*>)>::Action
            ((Action<int_(std::initializer_list<const_char_*>)> *)&local_d8,impl);
  pTVar2 = testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::WillOnce
                     (pTVar2,(Action<int_(std::initializer_list<const_char_*>)> *)&local_d8);
  (*(pTVar2->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_110,pTVar2);
  local_158.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_110.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_158.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_110.expectation_base_.
          super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_110.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_110.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.expectation_base_.
            super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_110.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.expectation_base_.
            super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  testing::Expectation::~Expectation(&local_110);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&local_38.matchers_);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.matchers_.
         super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
         .
         super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_head_impl.impl_.string_._M_dataplus._M_p !=
      &local_90.matchers_.
       super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
       .
       super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
       ._M_head_impl.impl_.string_.field_2) {
    operator_delete(local_90.matchers_.
                    super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                    ._M_head_impl.impl_.string_._M_dataplus._M_p,
                    local_90.matchers_.
                    super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Head_base<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                    ._M_head_impl.impl_.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.matchers_.
         super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
         .
         super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
         .
         super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
         ._M_head_impl.impl_.string_._M_dataplus._M_p !=
      &local_90.matchers_.
       super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
       .
       super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
       .
       super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
       ._M_head_impl.impl_.string_.field_2) {
    operator_delete(local_90.matchers_.
                    super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                    ._M_head_impl.impl_.string_._M_dataplus._M_p,
                    local_90.matchers_.
                    super__Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
                    .
                    super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                    ._M_head_impl.impl_.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.impl_.string_._M_dataplus._M_p != &local_100.impl_.string_.field_2) {
    operator_delete(local_100.impl_.string_._M_dataplus._M_p,
                    CONCAT44(local_100.impl_.string_.field_2._M_allocated_capacity._4_4_,
                             local_100.impl_.string_.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_100.impl_.string_._M_string_length =
       (size_type)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::EqMatcher<int>,true>>()
       ::kVTable;
  local_100.impl_.string_._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00198450;
  local_100.impl_.string_.field_2._M_allocated_capacity._0_4_ = pid;
  test_watch_thread::gmock_kill
            ((MockSpec<void_(const_int_&)> *)local_138,gc,(Matcher<const_int_&> *)&local_100);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                     ((MockSpec<void_(const_int_&)> *)local_138,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                      ,0x7d,"gc","kill (Eq (pid))");
  pTVar3 = testing::internal::TypedExpectation<void_(const_int_&)>::Times(pTVar3,1);
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_90,&local_158);
  testing::internal::TypedExpectation<void_(const_int_&)>::After(pTVar3,(ExpectationSet *)&local_90)
  ;
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_90);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_138 + 8));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_100);
  testing::Expectation::~Expectation(&local_158);
  return;
}

Assistant:

void Gc::expect_call (test_watch_thread & gc, std::string const & path,
                          process_identifier pid) {
        Expectation const exp =
            EXPECT_CALL (gc,
                         spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr)))
                .WillOnce (Return (pid));
        EXPECT_CALL (gc, kill (Eq (pid))).Times (1).After (exp);
    }